

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertWithExpressions<mp::AlgebraicExpression<mp::LinTerms>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *con,int i,
          ConstraintAcceptanceLevel param_4,ExpressionAcceptanceLevel param_5)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x40) == 1) {
    HandleLogicalArgs<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>>
              (this,con,i);
  }
  return false;
}

Assistant:

bool ConvertWithExpressions(
      const ComplementarityConstraint<Expr>& con,
      int i,
      ConstraintAcceptanceLevel , ExpressionAcceptanceLevel ) {
    if (1==stage_cvt2expr_)
      HandleLogicalArgs(con, i);         // explicify logical args
    if (false                      // TODO check acc for NLCompl
        && 1==stage_cvt2expr_
        && !con.GetExpression().is_variable()) {             // already a variable
      ConvertComplementarityExpr(con, i);
      return true;
    }
    return false;
  }